

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flexbuffers.h
# Opt level: O2

bool __thiscall
flexbuffers::Verifier::VerifyVector(Verifier *this,Reference r,uint8_t *p,Type elem_type)

{
  pointer puVar1;
  bool bVar2;
  BitWidth BVar3;
  ulong uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  uint8_t *puVar8;
  byte byte_width;
  size_t i;
  size_t i_00;
  Reference RVar9;
  Vector v;
  Sized sized;
  
  uVar6 = this->depth_ + 1;
  this->depth_ = uVar6;
  uVar4 = this->num_vectors_ + 1;
  this->num_vectors_ = uVar4;
  if (this->max_depth_ < uVar6) {
    return false;
  }
  if (this->max_vectors_ < uVar4) {
    return false;
  }
  uVar4 = r._8_8_ >> 8 & 0xff;
  if (uVar4 <= (ulong)((long)p - (long)this->buf_)) {
    uVar6 = r._8_8_ >> 0x20;
    if (this->reuse_tracker_ != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
      BVar3 = Builder::WidthB(uVar4);
      bVar5 = (char)r.type_ * '\x04' | (byte)BVar3;
      lVar7 = -(long)this->buf_ - uVar4;
      puVar1 = (this->reuse_tracker_->
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if (p[(long)(puVar1 + lVar7)] == bVar5) {
        return true;
      }
      if (p[(long)(puVar1 + lVar7)] != 0) {
        return false;
      }
      p[(long)(puVar1 + lVar7)] = bVar5;
    }
    byte_width = r.byte_width_;
    Sized::Sized(&sized,p,byte_width);
    bVar5 = byte_width;
    if (uVar6 == 0x19) {
      bVar5 = 1;
    }
    if (uVar6 == 5) {
      bVar5 = 1;
    }
    if (0xffffffffffffffff / (ulong)bVar5 <= sized.size_) {
      return false;
    }
    uVar6 = sized.size_ * bVar5;
    uVar4 = this->size_;
    if (uVar4 <= uVar6) {
      return false;
    }
    if (uVar4 - uVar6 < (ulong)((long)p - (long)this->buf_)) {
      return false;
    }
    if (elem_type == FBT_KEY) {
      Sized::Sized(&v.super_Sized,p,bVar5);
      uVar4 = 0;
      do {
        if (sized.size_ == uVar4) goto LAB_00228610;
        if (uVar4 < v.super_Sized.size_) {
          puVar8 = v.super_Sized.super_Object.data_ + uVar4 * v.super_Sized.super_Object.byte_width_
          ;
          lVar7 = (ulong)v.super_Sized.super_Object.byte_width_ + 0x400000100;
        }
        else {
          lVar7 = 0x101;
          puVar8 = (uint8_t *)0x0;
        }
        RVar9.parent_width_ = (char)lVar7;
        RVar9.byte_width_ = (char)((ulong)lVar7 >> 8);
        RVar9._10_2_ = (short)((ulong)lVar7 >> 0x10);
        RVar9.type_ = (int)((ulong)lVar7 >> 0x20);
        RVar9.data_ = puVar8;
        bVar2 = VerifyRef(this,RVar9);
        uVar4 = uVar4 + 1;
      } while (bVar2);
    }
    else {
      if (elem_type != FBT_NULL) {
        if (elem_type != FBT_BOOL && 3 < (int)elem_type) {
          __assert_fail("IsInline(elem_type)",
                        "/workspace/llm4binary/github/license_c_cmakelists/google[P]flatbuffers/include/flatbuffers/flexbuffers.h"
                        ,0x71e,
                        "bool flexbuffers::Verifier::VerifyVector(Reference, const uint8_t *, Type)"
                       );
        }
LAB_00228610:
        this->depth_ = this->depth_ - 1;
        return true;
      }
      if (uVar4 <= sized.size_) {
        return false;
      }
      if ((uint8_t *)(uVar4 - sized.size_) < p + (uVar6 - (long)this->buf_)) {
        return false;
      }
      Sized::Sized(&v.super_Sized,p,byte_width);
      i_00 = 0;
      do {
        if (sized.size_ == i_00) goto LAB_00228610;
        RVar9 = Vector::operator[](&v,i_00);
        bVar2 = VerifyRef(this,RVar9);
        i_00 = i_00 + 1;
      } while (bVar2);
    }
  }
  return false;
}

Assistant:

bool VerifyVector(Reference r, const uint8_t *p, Type elem_type) {
    // Any kind of nesting goes thru this function, so guard against that
    // here, both with simple nesting checks, and the reuse tracker if on.
    depth_++;
    num_vectors_++;
    if (!Check(depth_ <= max_depth_ && num_vectors_ <= max_vectors_))
      return false;
    auto size_byte_width = r.byte_width_;
    if (!VerifyBeforePointer(p, size_byte_width)) return false;
    FLEX_CHECK_VERIFIED(p - size_byte_width,
                        PackedType(Builder::WidthB(size_byte_width), r.type_));
    auto sized = Sized(p, size_byte_width);
    auto num_elems = sized.size();
    auto elem_byte_width = r.type_ == FBT_STRING || r.type_ == FBT_BLOB
                               ? uint8_t(1)
                               : r.byte_width_;
    auto max_elems = SIZE_MAX / elem_byte_width;
    if (!Check(num_elems < max_elems))
      return false;  // Protect against byte_size overflowing.
    auto byte_size = num_elems * elem_byte_width;
    if (!VerifyFromPointer(p, byte_size)) return false;
    if (elem_type == FBT_NULL) {
      // Verify type bytes after the vector.
      if (!VerifyFromPointer(p + byte_size, num_elems)) return false;
      auto v = Vector(p, size_byte_width);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else if (elem_type == FBT_KEY) {
      auto v = TypedVector(p, elem_byte_width, FBT_KEY);
      for (size_t i = 0; i < num_elems; i++)
        if (!VerifyRef(v[i])) return false;
    } else {
      FLATBUFFERS_ASSERT(IsInline(elem_type));
    }
    depth_--;
    return true;
  }